

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutlineHandler.cpp
# Opt level: O2

void __thiscall
OutlineHandler::run(OutlineHandler *this,Id *id,
                   optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                   *paramsOpt)

{
  pointer pDVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type this_01;
  Ch *__s;
  File *file;
  DocumentSymbol *symbol;
  pointer this_02;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> symbols;
  string uri;
  char *local_e0;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> local_d8;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_b8;
  string local_78;
  Stack<rapidjson::CrtAllocator> local_58;
  
  if (paramsOpt->is_some == false) {
    sendError(id,InvalidParams,"missing params",(Value *)0x0);
    return;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)paramsOpt,"textDocument");
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_00,"uri");
  __s = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(this_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,__s,(allocator<char> *)&local_b8);
  file = FileManager::get(&local_78);
  if (file == (File *)0x0) {
    std::operator<<((ostream *)&std::cerr,"!!! Null file !!!\n");
    sendNullResult(id);
    goto LAB_001804fc;
  }
  local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (file->type == Bib) {
    getOutlineForBibFile((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_b8,file);
LAB_0018039c:
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::_M_move_assign
              (&local_d8,&local_b8);
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector
              ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_b8);
    local_b8.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_58;
    local_58.stack_ = (char *)0x0;
    local_58.stackTop_ = (char *)0x0;
    local_58.stackEnd_ = (char *)0x0;
    local_58.allocator_ = (CrtAllocator *)0x0;
    local_58.ownAllocator_ = (CrtAllocator *)0x0;
    local_58.initialCapacity_ = 0x100;
    local_b8.level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_b8.level_stack_.stackEnd_ = (char *)0x0;
    local_b8.level_stack_.stack_ = (char *)0x0;
    local_b8.level_stack_.stackTop_ = (char *)0x0;
    local_b8.level_stack_.initialCapacity_ = 0x200;
    local_b8.maxDecimalPlaces_ = 0x144;
    local_b8.hasRoot_ = false;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject(&local_b8);
    local_e0 = "jsonrpc";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key(&local_b8,&local_e0);
    local_e0 = "2.0";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_b8,&local_e0);
    local_e0 = "id";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key(&local_b8,&local_e0);
    Id::writeId(id,&local_b8);
    local_e0 = "result";
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::Key(&local_b8,&local_e0);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(&local_b8);
    pDVar1 = local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_02 = local_d8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_02 != pDVar1;
        this_02 = this_02 + 1) {
      DocumentSymbol::reflect((DocumentSymbol *)this_02,&local_b8);
    }
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(&local_b8,0);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject(&local_b8,0);
    sendMessage((StringBuffer *)&local_58);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_b8.level_stack_);
    rapidjson::internal::Stack<rapidjson::CrtAllocator>::~Stack(&local_58);
  }
  else {
    if (file->type == Tex) {
      getOutlineForLatexFile
                ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_b8,file);
      goto LAB_0018039c;
    }
    sendNullResult(id);
  }
  std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector(&local_d8);
LAB_001804fc:
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void OutlineHandler::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "missing params");
        return;
    }

    Value &params = *paramsOpt; // TODO: Make function

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    vector<DocumentSymbol> symbols;
    switch (file->type) {
        case File::Type::Tex:
            symbols = getOutlineForLatexFile(*file);
            break;
        case File::Type::Bib:
            symbols = getOutlineForBibFile(*file);
            break;
        default:
            sendNullResult(id);
            return;
    }

    INIT_WRITER
    ADD_ID(id);
    writer.Key("result");
    writer.StartArray();
    for (auto &symbol : symbols) {
        symbol.reflect(writer);
    }
    writer.EndArray();
    SEND_MESSAGE
}